

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O1

size_t __thiscall Jupiter::DataBuffer::shrink(DataBuffer *this)

{
  uint8_t *puVar1;
  size_t __n;
  
  puVar1 = this->head;
  __n = (long)this->end - (long)puVar1;
  this->bufferSize = __n;
  if (this->base != puVar1) {
    memmove(this->base,puVar1,__n);
  }
  puVar1 = (uint8_t *)realloc(this->base,this->bufferSize);
  this->base = puVar1;
  this->head = puVar1;
  this->end = puVar1 + this->bufferSize;
  return this->bufferSize;
}

Assistant:

size_t Jupiter::DataBuffer::shrink() {
	Jupiter::DataBuffer::bufferSize = Jupiter::DataBuffer::size();

	if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
		memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, Jupiter::DataBuffer::bufferSize);

	Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, Jupiter::DataBuffer::bufferSize));
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + Jupiter::DataBuffer::bufferSize;
	return Jupiter::DataBuffer::bufferSize;
}